

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DPIImportSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::DPIImportSyntax,slang::syntax::DPIImportSyntax_const&>
          (BumpAllocator *this,DPIImportSyntax *args)

{
  DPIImportSyntax *pDVar1;
  DPIImportSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pDVar1 = (DPIImportSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::DPIImportSyntax::DPIImportSyntax(in_RSI,pDVar1);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }